

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cshutdn.c
# Opt level: O1

void cshutdn_run_conn_handler(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  
  if (((conn->bits).field_0x3 & 0x40) == 0) {
    if (conn->dns_entry != (Curl_dns_entry *)0x0) {
      Curl_resolv_unlink(data,&conn->dns_entry);
    }
    Curl_http_auth_cleanup_ntlm(conn);
    if ((conn->handler != (Curl_handler *)0x0) &&
       (conn->handler->disconnect != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr__Bool *)0x0)) {
      if (((data->state).field_0x7c0 & 0x10) != 0) {
        (data->set).timeout = 2000;
        Curl_pgrsTime(data,TIMER_STARTOP);
      }
      (*conn->handler->disconnect)
                (data,conn,(_Bool)((byte)((uint)*(undefined4 *)&conn->bits >> 0x1d) & 1));
    }
    puVar1 = &(conn->bits).field_0x3;
    *puVar1 = *puVar1 | 0x40;
  }
  return;
}

Assistant:

static void cshutdn_run_conn_handler(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  if(!conn->bits.shutdown_handler) {
    if(conn->dns_entry)
      Curl_resolv_unlink(data, &conn->dns_entry);

    /* Cleanup NTLM connection-related data */
    Curl_http_auth_cleanup_ntlm(conn);

    /* Cleanup NEGOTIATE connection-related data */
    Curl_http_auth_cleanup_negotiate(conn);

    if(conn->handler && conn->handler->disconnect) {
      /* Some disconnect handlers do a blocking wait on server responses.
       * FTP/IMAP/SMTP and SFTP are among them. When using the internal
       * handle, set an overall short timeout so we do not hang for the
       * default 120 seconds. */
      if(data->state.internal) {
        data->set.timeout = DEFAULT_SHUTDOWN_TIMEOUT_MS;
        (void)Curl_pgrsTime(data, TIMER_STARTOP);
      }

      /* This is set if protocol-specific cleanups should be made */
      DEBUGF(infof(data, "connection #%" FMT_OFF_T
                   ", shutdown protocol handler (aborted=%d)",
                   conn->connection_id, conn->bits.aborted));
      /* There are protocol handlers that block on retrieving
       * server responses here (FTP). Set a short timeout. */
      conn->handler->disconnect(data, conn, conn->bits.aborted);
    }

    conn->bits.shutdown_handler = TRUE;
  }
}